

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O2

string * __thiscall
duckdb::ErrorData::ConstructFinalMessage_abi_cxx11_(string *__return_storage_ptr__,ErrorData *this)

{
  ExceptionType in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->type != UNKNOWN_TYPE) {
    Exception::ExceptionTypeToString_abi_cxx11_(&local_38,(Exception *)(ulong)this->type,in_DL);
    ::std::operator+(&bStack_58,&local_38," ");
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_58);
    ::std::__cxx11::string::~string((string *)&bStack_58);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  ::std::operator+(&bStack_58,"Error: ",&this->raw_message);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_58);
  if (this->type == INTERNAL) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string ErrorData::ConstructFinalMessage() const {
	std::string error;
	if (type != ExceptionType::UNKNOWN_TYPE) {
		error = Exception::ExceptionTypeToString(type) + " ";
	}
	error += "Error: " + raw_message;
	if (type == ExceptionType::INTERNAL) {
		error += "\nThis error signals an assertion failure within DuckDB. This usually occurs due to "
		         "unexpected conditions or errors in the program's logic.\nFor more information, see "
		         "https://duckdb.org/docs/stable/dev/internal_errors";
	}
	return error;
}